

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadFunctionTag(BCReaderState *s)

{
  ushort uVar1;
  JSContext *ctx;
  ushort *puVar2;
  JSRuntime *pJVar3;
  list_head *plVar4;
  JSClosureVar *pJVar5;
  JSValue *pJVar6;
  int iVar7;
  uint32_t uVar8;
  uint8_t *buf;
  undefined2 uVar9;
  long lVar10;
  JSVarDef *pJVar11;
  int64_t iVar12;
  long lVar13;
  uint32_t *pval;
  undefined8 *puVar14;
  JSValueUnion JVar15;
  JSRefCountHeader *p;
  JSValueUnion b;
  long lVar16;
  ulong uVar17;
  int *pval_00;
  byte bVar18;
  JSValue JVar19;
  JSValue JVar20;
  uint8_t v8;
  int local_count;
  int var_idx;
  byte local_e5;
  uint local_e4;
  JSVarDef *local_e0;
  int local_d4;
  ulong local_d0;
  uint16_t local_c4 [2];
  ulong local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  uint32_t uStack_90;
  undefined1 auStack_8c [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar18 = 0;
  ctx = s->ctx;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  _uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_b8 = 1;
  puVar2 = (ushort *)s->ptr;
  if ((long)s->buf_end - (long)puVar2 < 2) {
    if (s->error_state == 0) {
      JS_ThrowSyntaxError(ctx,"read after the end of the buffer");
    }
    s->error_state = -1;
  }
  else {
    uVar1 = *puVar2;
    s->ptr = (uint8_t *)(puVar2 + 1);
    uStack_a0 = (ulong)((ushort)(*(uint *)&s->field_0x34 >> 4) & 0x1000 | uVar1 & 0xfff) << 8;
    iVar7 = bc_get_u8(s,&local_e5);
    iVar12 = 6;
    if (iVar7 == 0) {
      uStack_a0 = CONCAT71(uStack_a0._1_7_,local_e5);
      iVar7 = bc_get_atom(s,(JSAtom *)auStack_8c);
      if (iVar7 == 0) {
        iVar7 = bc_get_leb128(s,&local_e4);
        b.float64 = 0.0;
        uVar9 = 0;
        if (iVar7 == 0) {
          uVar9 = (undefined2)local_e4;
        }
        local_78 = CONCAT62(local_78._2_6_,uVar9);
        if (iVar7 != 0) goto LAB_0013c5ba;
        iVar7 = bc_get_leb128(s,&local_e4);
        b.float64 = 0.0;
        uVar9 = 0;
        if (iVar7 == 0) {
          uVar9 = (undefined2)local_e4;
        }
        local_78._0_4_ = CONCAT22(uVar9,(undefined2)local_78);
        if (iVar7 != 0) goto LAB_0013c5ba;
        iVar7 = bc_get_leb128(s,&local_e4);
        b.float64 = 0.0;
        uVar9 = 0;
        if (iVar7 == 0) {
          uVar9 = (undefined2)local_e4;
        }
        local_78._0_6_ = CONCAT24(uVar9,(undefined4)local_78);
        if (iVar7 != 0) goto LAB_0013c5ba;
        iVar7 = bc_get_leb128(s,&local_e4);
        b.float64 = 0.0;
        uVar9 = 0;
        if (iVar7 == 0) {
          uVar9 = (undefined2)local_e4;
        }
        local_78 = CONCAT26(uVar9,(undefined6)local_78);
        if (iVar7 != 0) goto LAB_0013c5ba;
        iVar7 = bc_get_leb128(s,(uint32_t *)((long)&uStack_60 + 4));
        if ((((iVar7 == 0) && (iVar7 = bc_get_leb128(s,(uint32_t *)&uStack_60), iVar7 == 0)) &&
            (iVar7 = bc_get_leb128(s,&uStack_90), iVar7 == 0)) &&
           (iVar7 = bc_get_leb128(s,&local_e4), iVar7 == 0)) {
          local_e0 = (JSVarDef *)((ulong)(uStack_a0._1_2_ >> 5 & 0x20) + 0x60);
          local_c0 = uStack_60 & 0xffffffff;
          local_d0 = (ulong)local_e4;
          lVar13 = (long)local_e0 << 0x20;
          lVar16 = ((ulong)(local_e4 + (uint32_t)uStack_60) << 0x24) + lVar13;
          local_d4 = (int)((ulong)lVar16 >> 0x20) + uStack_60._4_4_ * 8;
          uVar8 = 0;
          if ((uStack_a0._1_2_ >> 0xc & 1) == 0) {
            uVar8 = uStack_90;
          }
          b.ptr = js_mallocz(ctx,(long)(int)(uVar8 + local_d4));
          if ((JSFunctionBytecode *)b.ptr != (JSFunctionBytecode *)0x0) {
            puVar14 = &local_b8;
            JVar15.ptr = b.ptr;
            for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(undefined8 *)JVar15.ptr = *puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              JVar15.float64 = JVar15.float64 + (ulong)bVar18 * -0x10 + 8;
            }
            *(undefined4 *)b.ptr = 1;
            if (local_d0 != 0) {
              *(JSVarDef **)((long)b.ptr + 0x30) =
                   (JSVarDef *)(((long)(lVar13 + (local_c0 << 0x24)) >> 0x20) + (long)b.ptr);
            }
            iVar7 = *(int *)((long)b.ptr + 0x5c);
            if (iVar7 != 0) {
              *(JSClosureVar **)((long)b.ptr + 0x38) =
                   (JSClosureVar *)((lVar16 >> 0x20) + (long)b.ptr);
            }
            if (*(int *)((long)b.ptr + 0x58) != 0) {
              *(JSValue **)((long)b.ptr + 0x50) =
                   (JSValue *)((long)&local_e0->var_name + (long)b.ptr);
            }
            pJVar3 = ctx->rt;
            *(undefined1 *)((long)b.ptr + 4) = 1;
            plVar4 = (pJVar3->gc_obj_list).prev;
            plVar4->next = (list_head *)((long)b.ptr + 8);
            ((list_head *)((long)b.ptr + 8))->prev = plVar4;
            *(list_head **)((long)b.ptr + 0x10) = &pJVar3->gc_obj_list;
            (pJVar3->gc_obj_list).prev = (list_head *)((long)b.ptr + 8);
            if (0 < (int)local_d0) {
              local_d0 = local_d0 << 4;
              uVar17 = 0;
              do {
                local_e0 = *(JSVarDef **)((long)b.ptr + 0x30);
                iVar7 = bc_get_atom(s,(JSAtom *)((long)&local_e0->var_name + uVar17));
                if ((iVar7 != 0) ||
                   (iVar7 = bc_get_leb128(s,(uint32_t *)((long)&local_e0->scope_level + uVar17)),
                   iVar7 != 0)) goto LAB_0013c91a;
                pval = (uint32_t *)((long)&local_e0->scope_next + uVar17);
                iVar7 = bc_get_leb128(s,pval);
                if (iVar7 != 0) goto LAB_0013c91a;
                *pval = *pval - 1;
                iVar7 = bc_get_u8(s,&local_e5);
                if (iVar7 != 0) goto LAB_0013c91a;
                *(uint *)(&local_e0->field_0xc + uVar17) =
                     local_e5 >> 4 & 7 |
                     (*(uint *)(&local_e0->field_0xc + uVar17) & 0xffffff80) + (local_e5 & 0xf) * 8;
                uVar17 = uVar17 + 0x10;
              } while (local_d0 != uVar17);
              iVar7 = *(int *)((long)b.ptr + 0x5c);
            }
            if (0 < iVar7) {
              pJVar11 = (JSVarDef *)0x4;
              lVar13 = 0;
              do {
                pJVar5 = *(JSClosureVar **)((long)b.ptr + 0x38);
                local_e0 = pJVar11;
                iVar7 = bc_get_atom(s,(JSAtom *)(&pJVar5->field_0x0 + (long)&pJVar11->var_name));
                if ((iVar7 != 0) || (iVar7 = bc_get_leb128(s,(uint32_t *)local_c4), iVar7 != 0))
                goto LAB_0013c91a;
                pJVar5[lVar13].var_idx = local_c4[0];
                iVar7 = bc_get_u8(s,&local_e5);
                if (iVar7 != 0) goto LAB_0013c91a;
                *(byte *)(pJVar5 + lVar13) = local_e5;
                lVar13 = lVar13 + 1;
                pJVar11 = (JSVarDef *)&local_e0->scope_next;
              } while (lVar13 < *(int *)((long)b.ptr + 0x5c));
            }
            iVar7 = JS_ReadFunctionBytecode
                              (s,(JSFunctionBytecode *)b.ptr,local_d4,*(int *)((long)b.ptr + 0x28));
            if (iVar7 == 0) {
              if ((*(byte *)((long)b.ptr + 0x1a) & 4) == 0) goto LAB_0013c978;
              iVar7 = bc_get_atom(s,(JSAtom *)((long)b.ptr + 0x60));
              if ((iVar7 == 0) &&
                 (iVar7 = bc_get_leb128(s,(uint32_t *)((long)b.ptr + 100)), iVar7 == 0)) {
                pval_00 = (int *)((long)b.ptr + 0x6c);
                iVar7 = bc_get_leb128(s,(uint32_t *)pval_00);
                if (iVar7 == 0) {
                  if ((long)*pval_00 != 0) {
                    buf = (uint8_t *)js_mallocz(ctx,(long)*pval_00);
                    *(uint8_t **)((long)b.ptr + 0x70) = buf;
                    if ((buf == (uint8_t *)0x0) || (iVar7 = bc_get_buf(s,buf,*pval_00), iVar7 != 0))
                    goto LAB_0013c91a;
                  }
LAB_0013c978:
                  if (0 < *(int *)((long)b.ptr + 0x58)) {
                    lVar16 = 8;
                    lVar13 = 0;
                    do {
                      JVar20 = JS_ReadObjectRec(s);
                      if ((int)JVar20.tag == 6) goto LAB_0013c91a;
                      pJVar6 = *(JSValue **)((long)b.ptr + 0x50);
                      *(JSValueUnion *)((long)pJVar6 + lVar16 + -8) = JVar20.u;
                      *(int64_t *)((long)&pJVar6->u + lVar16) = JVar20.tag;
                      lVar13 = lVar13 + 1;
                      lVar16 = lVar16 + 0x10;
                    } while (lVar13 < *(int *)((long)b.ptr + 0x58));
                  }
                  (ctx->header).ref_count = (ctx->header).ref_count + 1;
                  *(JSContext **)((long)b.ptr + 0x48) = ctx;
                  iVar12 = -2;
                  goto LAB_0013c5ba;
                }
              }
            }
LAB_0013c91a:
            iVar7 = *b.ptr;
            *(int *)b.ptr = iVar7 + -1;
            if (iVar7 < 2) {
              JVar20.tag = -2;
              JVar20.u.ptr = b.ptr;
              __JS_FreeValueRT(ctx->rt,JVar20);
            }
          }
        }
      }
    }
  }
  iVar12 = 6;
  b.float64 = 0.0;
LAB_0013c5ba:
  JVar19.tag = iVar12;
  JVar19.u.float64 = b.float64;
  return JVar19;
}

Assistant:

static JSValue JS_ReadFunctionTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSFunctionBytecode bc, *b;
    JSValue obj = JS_UNDEFINED;
    uint16_t v16;
    uint8_t v8;
    int idx, i, local_count;
    int function_size, cpool_offset, byte_code_offset;
    int closure_var_offset, vardefs_offset;

    memset(&bc, 0, sizeof(bc));
    bc.header.ref_count = 1;
    //bc.gc_header.mark = 0;

    if (bc_get_u16(s, &v16))
        goto fail;
    idx = 0;
    bc.has_prototype = bc_get_flags(v16, &idx, 1);
    bc.has_simple_parameter_list = bc_get_flags(v16, &idx, 1);
    bc.is_derived_class_constructor = bc_get_flags(v16, &idx, 1);
    bc.need_home_object = bc_get_flags(v16, &idx, 1);
    bc.func_kind = bc_get_flags(v16, &idx, 2);
    bc.new_target_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_call_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_allowed = bc_get_flags(v16, &idx, 1);
    bc.arguments_allowed = bc_get_flags(v16, &idx, 1);
    bc.has_debug = bc_get_flags(v16, &idx, 1);
    bc.backtrace_barrier = bc_get_flags(v16, &idx, 1);
    bc.read_only_bytecode = s->is_rom_data;
    if (bc_get_u8(s, &v8))
        goto fail;
    bc.js_mode = v8;
    if (bc_get_atom(s, &bc.func_name))  //@ atom leak if failure
        goto fail;
    if (bc_get_leb128_u16(s, &bc.arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.var_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.defined_arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.stack_size))
        goto fail;
    if (bc_get_leb128_int(s, &bc.closure_var_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.cpool_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.byte_code_len))
        goto fail;
    if (bc_get_leb128_int(s, &local_count))
        goto fail;

    if (bc.has_debug) {
        function_size = sizeof(*b);
    } else {
        function_size = offsetof(JSFunctionBytecode, debug);
    }
    cpool_offset = function_size;
    function_size += bc.cpool_count * sizeof(*bc.cpool);
    vardefs_offset = function_size;
    function_size += local_count * sizeof(*bc.vardefs);
    closure_var_offset = function_size;
    function_size += bc.closure_var_count * sizeof(*bc.closure_var);
    byte_code_offset = function_size;
    if (!bc.read_only_bytecode) {
        function_size += bc.byte_code_len;
    }

    b = js_mallocz(ctx, function_size);
    if (!b)
        return JS_EXCEPTION;
            
    memcpy(b, &bc, offsetof(JSFunctionBytecode, debug));
    b->header.ref_count = 1;
    if (local_count != 0) {
        b->vardefs = (void *)((uint8_t*)b + vardefs_offset);
    }
    if (b->closure_var_count != 0) {
        b->closure_var = (void *)((uint8_t*)b + closure_var_offset);
    }
    if (b->cpool_count != 0) {
        b->cpool = (void *)((uint8_t*)b + cpool_offset);
    }
    
    add_gc_object(ctx->rt, &b->header, JS_GC_OBJ_TYPE_FUNCTION_BYTECODE);
            
    obj = JS_MKPTR(JS_TAG_FUNCTION_BYTECODE, b);

#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, b->func_name); printf("\n");
#endif
    bc_read_trace(s, "args=%d vars=%d defargs=%d closures=%d cpool=%d\n",
                  b->arg_count, b->var_count, b->defined_arg_count,
                  b->closure_var_count, b->cpool_count);
    bc_read_trace(s, "stack=%d bclen=%d locals=%d\n",
                  b->stack_size, b->byte_code_len, local_count);

    if (local_count != 0) {
        bc_read_trace(s, "vars {\n");
        for(i = 0; i < local_count; i++) {
            JSVarDef *vd = &b->vardefs[i];
            if (bc_get_atom(s, &vd->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_level))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_next))
                goto fail;
            vd->scope_next--;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            vd->var_kind = bc_get_flags(v8, &idx, 4);
            vd->is_const = bc_get_flags(v8, &idx, 1);
            vd->is_lexical = bc_get_flags(v8, &idx, 1);
            vd->is_captured = bc_get_flags(v8, &idx, 1);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, vd->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    if (b->closure_var_count != 0) {
        bc_read_trace(s, "closure vars {\n");
        for(i = 0; i < b->closure_var_count; i++) {
            JSClosureVar *cv = &b->closure_var[i];
            int var_idx;
            if (bc_get_atom(s, &cv->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &var_idx))
                goto fail;
            cv->var_idx = var_idx;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            cv->is_local = bc_get_flags(v8, &idx, 1);
            cv->is_arg = bc_get_flags(v8, &idx, 1);
            cv->is_const = bc_get_flags(v8, &idx, 1);
            cv->is_lexical = bc_get_flags(v8, &idx, 1);
            cv->var_kind = bc_get_flags(v8, &idx, 4);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, cv->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    {
        bc_read_trace(s, "bytecode {\n");
        if (JS_ReadFunctionBytecode(s, b, byte_code_offset, b->byte_code_len))
            goto fail;
        bc_read_trace(s, "}\n");
    }
    if (b->has_debug) {
        /* read optional debug information */
        bc_read_trace(s, "debug {\n");
        if (bc_get_atom(s, &b->debug.filename))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.line_num))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.pc2line_len))
            goto fail;
        if (b->debug.pc2line_len) {
            b->debug.pc2line_buf = js_mallocz(ctx, b->debug.pc2line_len);
            if (!b->debug.pc2line_buf)
                goto fail;
            if (bc_get_buf(s, b->debug.pc2line_buf, b->debug.pc2line_len))
                goto fail;
        }
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "filename: "); print_atom(s->ctx, b->debug.filename); printf("\n");
#endif
        bc_read_trace(s, "}\n");
    }
    if (b->cpool_count != 0) {
        bc_read_trace(s, "cpool {\n");
        for(i = 0; i < b->cpool_count; i++) {
            JSValue val;
            val = JS_ReadObjectRec(s);
            if (JS_IsException(val))
                goto fail;
            b->cpool[i] = val;
        }
        bc_read_trace(s, "}\n");
    }
    b->realm = JS_DupContext(ctx);
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}